

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O2

void __thiscall FNodeBuilder::FixSplitSharers(FNodeBuilder *this,node_t *node)

{
  FEventTree *this_00;
  int iVar1;
  int splitvert;
  FSplitSharer *pFVar2;
  FPrivSeg *pFVar3;
  DWORD DVar4;
  DWORD DVar5;
  FEvent *pFVar6;
  FEvent *event;
  FEvent *pFVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  this_00 = &this->Events;
  uVar8 = 0;
  do {
    if ((this->SplitSharers).Count <= uVar8) {
      return;
    }
    pFVar2 = (this->SplitSharers).Array;
    uVar9 = (ulong)pFVar2[uVar8].Seg;
    iVar1 = (this->Segs).Array[uVar9].v2;
    pFVar6 = FEventTree::FindEvent(this_00,pFVar2[uVar8].Distance);
    if (pFVar6 != (FEvent *)0x0) {
      if ((this->SplitSharers).Array[uVar8].Forward == true) {
        pFVar6 = FEventTree::GetSuccessor(this_00,pFVar6);
        if (pFVar6 != (FEvent *)0x0) {
          event = FEventTree::GetSuccessor(this_00,pFVar6);
LAB_00473217:
          while ((event != (FEvent *)0x0 && (splitvert = (pFVar6->Info).Vertex, splitvert != iVar1))
                ) {
            DVar4 = SplitSeg(this,(DWORD)uVar9,splitvert,1);
            pFVar3 = (this->Segs).Array;
            pFVar3[DVar4].next = pFVar3[uVar9].next;
            pFVar3[uVar9].next = DVar4;
            uVar10 = (ulong)pFVar3[uVar9].partner;
            if (uVar10 != 0xffffffff) {
              DVar5 = SplitSeg(this,pFVar3[uVar9].partner,(pFVar6->Info).Vertex,1);
              pFVar3 = (this->Segs).Array;
              pFVar3[(int)DVar5].next = pFVar3[uVar10].next;
              pFVar3[uVar10].next = DVar5;
              pFVar3[uVar9].partner = DVar5;
              pFVar3[uVar10].partner = DVar4;
            }
            if ((this->SplitSharers).Array[uVar8].Forward == true) {
              pFVar7 = FEventTree::GetSuccessor(this_00,event);
            }
            else {
              pFVar7 = FEventTree::GetPredecessor(this_00,event);
            }
            uVar9 = (ulong)DVar4;
            pFVar6 = event;
            event = pFVar7;
          }
        }
      }
      else {
        pFVar6 = FEventTree::GetPredecessor(this_00,pFVar6);
        if (pFVar6 != (FEvent *)0x0) {
          event = FEventTree::GetPredecessor(this_00,pFVar6);
          goto LAB_00473217;
        }
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void FNodeBuilder::FixSplitSharers (const node_t &node)
{
	D(Printf(PRINT_LOG, "events:\n"));
	D(Events.PrintTree());
	for (unsigned int i = 0; i < SplitSharers.Size(); ++i)
	{
		DWORD seg = SplitSharers[i].Seg;
		int v2 = Segs[seg].v2;
		FEvent *event = Events.FindEvent (SplitSharers[i].Distance);
		FEvent *next;

		if (event == NULL)
		{ // Should not happen
			continue;
		}

		// Use the CRT's printf so the formatting matches ZDBSP's
		D(char buff[200]);
		D(sprintf(buff, "Considering events on seg %d(%d[%d,%d]->%d[%d,%d]) [%g:%g]\n", seg,
			Segs[seg].v1,
			Vertices[Segs[seg].v1].x>>16,
			Vertices[Segs[seg].v1].y>>16,
			Segs[seg].v2,
			Vertices[Segs[seg].v2].x>>16,
			Vertices[Segs[seg].v2].y>>16,
			SplitSharers[i].Distance, event->Distance));
		D(Printf(PRINT_LOG, "%s", buff));

		if (SplitSharers[i].Forward)
		{
			event = Events.GetSuccessor (event);
			if (event == NULL)
			{
				continue;
			}
			next = Events.GetSuccessor (event);
		}
		else
		{
			event = Events.GetPredecessor (event);
			if (event == NULL)
			{
				continue;
			}
			next = Events.GetPredecessor (event);
		}

		while (event != NULL && next != NULL && event->Info.Vertex != v2)
		{
			D(Printf(PRINT_LOG, "Forced split of seg %d(%d->%d) at %d(%d,%d)\n", seg,
				Segs[seg].v1, Segs[seg].v2,
				event->Info.Vertex,
				Vertices[event->Info.Vertex].x>>16,
				Vertices[event->Info.Vertex].y>>16));

			DWORD newseg = SplitSeg (seg, event->Info.Vertex, 1);

			Segs[newseg].next = Segs[seg].next;
			Segs[seg].next = newseg;

			DWORD partner = Segs[seg].partner;
			if (partner != DWORD_MAX)
			{
				int endpartner = SplitSeg (partner, event->Info.Vertex, 1);

				Segs[endpartner].next = Segs[partner].next;
				Segs[partner].next = endpartner;

				Segs[seg].partner = endpartner;
				Segs[partner].partner = newseg;
			}

			seg = newseg;
			if (SplitSharers[i].Forward)
			{
				event = next;
				next = Events.GetSuccessor (next);
			}
			else
			{
				event = next;
				next = Events.GetPredecessor (next);
			}
		}
	}
}